

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O0

int __thiscall
OpenAmulet::Map<int,_int,_std::less<int>_>::GetAt(Map<int,_int,_std::less<int>_> *this,int *aKey)

{
  bool bVar1;
  reference ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  int *aKey_local;
  Map<int,_int,_std::less<int>_> *this_local;
  
  it._M_node = (_Base_ptr)aKey;
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (&this->mMap,aKey);
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 (&this->mMap);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*(&local_28);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    this_local._4_4_ = this->mDefaultReturn;
  }
  return this_local._4_4_;
}

Assistant:

Item GetAt(const Key &aKey) const
  {
#ifdef DEBUG
    // This is for debugging propose only. If you want to look at the
    // map change the dumpMap value to true within your debugger
    bool dumpMap(false);
    if (dumpMap == true) {
      Dump();
    }
#endif

    // do we have an item with aKey?
    typename std::map<Key, Item, Compare>::const_iterator it = mMap.find(aKey);
    if (it != mMap.end()) {
      return ((*it).second);
    } else {
      // the key wasn't found so return the default object value
      return (mDefaultReturn);
    }
  }